

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

bool __thiscall
QAbstractItemView::edit
          (QAbstractItemView *this,QModelIndex *index,EditTrigger trigger,QEvent *event)

{
  EditTrigger EVar1;
  QAbstractItemViewPrivate *this_00;
  Data *pDVar2;
  Data *pDVar3;
  QWidget *this_01;
  QAbstractItemModel *pQVar4;
  bool bVar5;
  char cVar6;
  FocusPolicy FVar7;
  int iVar8;
  QEditorInfo *pQVar9;
  QEvent *event_00;
  long in_FS_OFFSET;
  QPersistentModelIndex safeIndex;
  QModelIndex local_70;
  QModelIndex local_58;
  QPersistentModelIndex local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = false;
  if ((index->r < 0) || (bVar5 = false, index->c < 0)) goto LAB_00536a91;
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  if ((index->m).ptr != this_00->model) {
LAB_0053692d:
    bVar5 = false;
    goto LAB_00536a91;
  }
  pDVar2 = (this_00->persistent).q_hash.d;
  if ((pDVar2 != (Data *)0x0) && (pDVar2->size != 0)) {
    pQVar9 = QAbstractItemViewPrivate::editorForIndex(this_00,index);
    pDVar3 = (pQVar9->widget).wp.d;
    if ((pDVar3 != (Data *)0x0) &&
       ((*(int *)(pDVar3 + 4) != 0 &&
        (this_01 = (QWidget *)(pQVar9->widget).wp.value, this_01 != (QWidget *)0x0)))) {
      FVar7 = QWidget::focusPolicy(this_01);
      if (FVar7 != NoFocus) {
        if (this_00->waitForIMCommit == false) {
          QWidget::setFocus(this_01,OtherFocusReason);
        }
        else {
          QWidget::updateMicroFocus((QWidget *)this,ImQueryAll);
        }
        bVar5 = true;
        goto LAB_00536a91;
      }
      goto LAB_0053692d;
    }
  }
  if (trigger == CurrentChanged) {
LAB_005369bc:
    QBasicTimer::stop();
  }
  else if (trigger == DoubleClicked) {
    QBasicTimer::stop();
    goto LAB_005369bc;
  }
  local_40.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::QPersistentModelIndex(&local_40,index);
  bVar5 = QAbstractItemViewPrivate::sendDelegateEvent(this_00,index,event);
  if (bVar5) {
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,&local_40);
    update(this,&local_58);
LAB_00536a0d:
    bVar5 = true;
  }
  else {
    cVar6 = QPersistentModelIndex::isValid();
    if (cVar6 != '\0') {
      EVar1 = this_00->lastTrigger;
      this_00->lastTrigger = trigger;
      pQVar4 = this_00->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_70,&local_40);
      (**(code **)(*(long *)pQVar4 + 0x148))(&local_58,pQVar4,&local_70);
      bVar5 = QAbstractItemViewPrivate::shouldEdit(this_00,trigger,&local_58);
      if (((bVar5) && ((this_00->delayedEditing).m_id == Invalid)) &&
         ((trigger != SelectedClicked || (EVar1 != DoubleClicked)))) {
        if (trigger == SelectedClicked) {
          iVar8 = QApplication::doubleClickInterval();
          QBasicTimer::start(&this_00->delayedEditing,(long)iVar8 * 1000000,1,this);
        }
        else {
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,&local_40);
          if ((event == (QEvent *)0x0) ||
             ((trigger &
              (this_00->editTriggers).super_QFlagsStorageHelper<QAbstractItemView::EditTrigger,_4>.
              super_QFlagsStorage<QAbstractItemView::EditTrigger>.i) != AnyKeyPressed)) {
            event_00 = (QEvent *)0x0;
          }
          else {
            event_00 = (QEvent *)0x0;
            if (*(ushort *)(event + 8) - 2 < 5) {
              event_00 = event;
            }
          }
          QAbstractItemViewPrivate::openEditor(this_00,&local_58,event_00);
        }
        goto LAB_00536a0d;
      }
    }
    bVar5 = false;
  }
  QPersistentModelIndex::~QPersistentModelIndex(&local_40);
LAB_00536a91:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool QAbstractItemView::edit(const QModelIndex &index, EditTrigger trigger, QEvent *event)
{
    Q_D(QAbstractItemView);

    if (!d->isIndexValid(index))
        return false;

    if (QWidget *w = (d->persistent.isEmpty() ? static_cast<QWidget*>(nullptr) : d->editorForIndex(index).widget.data())) {
        if (w->focusPolicy() == Qt::NoFocus)
            return false;
        if (!d->waitForIMCommit)
            w->setFocus();
        else
            updateMicroFocus();
        return true;
    }

    if (trigger == DoubleClicked) {
        d->delayedEditing.stop();
        d->delayedAutoScroll.stop();
    } else if (trigger == CurrentChanged) {
        d->delayedEditing.stop();
    }

    // in case e.g. setData() triggers a reset()
    QPersistentModelIndex safeIndex(index);

    if (d->sendDelegateEvent(index, event)) {
        update(safeIndex);
        return true;
    }

    if (!safeIndex.isValid()) {
        return false;
    }

    // save the previous trigger before updating
    EditTriggers lastTrigger = d->lastTrigger;
    d->lastTrigger = trigger;

    if (!d->shouldEdit(trigger, d->model->buddy(safeIndex)))
        return false;

    if (d->delayedEditing.isActive())
        return false;

    // we will receive a mouseButtonReleaseEvent after a
    // mouseDoubleClickEvent, so we need to check the previous trigger
    if (lastTrigger == DoubleClicked && trigger == SelectedClicked)
        return false;

    // we may get a double click event later
    if (trigger == SelectedClicked)
        d->delayedEditing.start(QApplication::doubleClickInterval(), this);
    else
        d->openEditor(safeIndex, d->shouldForwardEvent(trigger, event) ? event : nullptr);

    return true;
}